

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::ternary_each<signed_char>
          (Omega_h *this,Bytes *cond,Read<signed_char> *a,Read<signed_char> *b)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  int iVar4;
  int iVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  LO LVar7;
  Read<signed_char> RVar8;
  Write<signed_char> c;
  type f;
  Write<signed_char> local_a8;
  int local_8c;
  Write<signed_char> local_88;
  type local_78;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar4 = (int)pAVar2->size;
  }
  else {
    iVar4 = (int)((ulong)pAVar2 >> 3);
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    iVar5 = (int)pAVar3->size;
  }
  else {
    iVar5 = (int)((ulong)pAVar3 >> 3);
  }
  if (iVar4 == iVar5) {
    if (((ulong)pAVar2 & 1) == 0) {
      iVar4 = (int)pAVar2->size;
    }
    else {
      iVar4 = (int)((ulong)pAVar2 >> 3);
    }
    pAVar2 = (cond->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      iVar5 = (int)pAVar2->size;
    }
    else {
      iVar5 = (int)((ulong)pAVar2 >> 3);
    }
    local_8c = divide_no_remainder<int>(iVar4,iVar5);
    pAVar2 = (a->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      LVar7 = (LO)pAVar2->size;
    }
    else {
      LVar7 = (LO)((ulong)pAVar2 >> 3);
    }
    local_78.c.shared_alloc_.alloc = (Alloc *)&local_78.cond;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    Write<signed_char>::Write(&local_a8,LVar7,(string *)&local_78);
    if (local_78.c.shared_alloc_.alloc != (Alloc *)&local_78.cond) {
      operator_delete(local_78.c.shared_alloc_.alloc,
                      (ulong)((long)&(local_78.cond.write_.shared_alloc_.alloc)->size + 1));
    }
    local_78.c.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.c.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.c.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
    local_78.cond.write_.shared_alloc_.alloc = (cond->write_).shared_alloc_.alloc;
    if (((ulong)local_78.cond.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.cond.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.cond.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.cond.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.cond.write_.shared_alloc_.alloc)->use_count =
             (local_78.cond.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.cond.write_.shared_alloc_.direct_ptr = (cond->write_).shared_alloc_.direct_ptr;
    local_78.width = local_8c;
    local_78.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_78.a.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.a.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.a.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.a.write_.shared_alloc_.alloc)->use_count =
             (local_78.a.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    local_78.b.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_78.b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.b.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.b.write_.shared_alloc_.alloc)->use_count =
             (local_78.b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.b.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
    if (((ulong)local_a8.shared_alloc_.alloc & 1) == 0) {
      LVar7 = (LO)(local_a8.shared_alloc_.alloc)->size;
    }
    else {
      LVar7 = (LO)((ulong)local_a8.shared_alloc_.alloc >> 3);
    }
    parallel_for<Omega_h::ternary_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (LVar7,&local_78,"ternary_each");
    local_88.shared_alloc_.alloc = local_a8.shared_alloc_.alloc;
    local_88.shared_alloc_.direct_ptr = local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_88.shared_alloc_.alloc = (Alloc *)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<signed_char>::Read((Read<signed_char> *)this,&local_88);
    pAVar2 = local_88.shared_alloc_.alloc;
    if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
        local_88.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    ternary_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)
    ::{lambda(int)#1}::~Read((_lambda_int__1_ *)&local_78);
    pAVar2 = local_a8.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    RVar8.write_.shared_alloc_.direct_ptr = pvVar6;
    RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar8.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x137);
}

Assistant:

Read<T> ternary_each(Bytes cond, Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto width = divide_no_remainder(a.size(), cond.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = cond[i / width] ? a[i] : b[i]; };
  parallel_for(c.size(), f, "ternary_each");
  return c;
}